

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void DoOneIntegrationTest
               (List<MiniScript::String> *sourceLines,long sourceLineNum,
               List<MiniScript::String> *expectedOutput,long outputLineNum)

{
  ListStorage<MiniScript::String> *pLVar1;
  size_t sVar2;
  size_t sVar3;
  ListStorage<MiniScript::String> *pLVar4;
  StringStorage *pSVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  long *plVar8;
  StringStorage *pSVar9;
  char *pcVar10;
  StringStorage *pSVar11;
  long lVar12;
  String *pSVar13;
  unsigned_long uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  String *s;
  size_t sVar17;
  long lVar18;
  undefined1 auVar19 [8];
  long lVar20;
  Interpreter miniscript;
  unsigned_long local_148;
  StringStorage *local_140;
  char local_138;
  String local_130;
  String local_120;
  size_t local_110;
  List<MiniScript::String> *local_108;
  long *local_100;
  long local_f8;
  String local_f0;
  String local_e0;
  long *local_d0;
  char local_c8;
  String local_c0;
  String local_b0;
  String local_a0;
  List<MiniScript::String> local_90;
  undefined1 local_80 [8];
  code *local_78;
  code *local_70;
  code *local_68;
  unsigned_long local_38;
  
  local_108 = expectedOutput;
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  MiniScript::List<MiniScript::String>::List(&local_90,sourceLines);
  MiniScript::Interpreter::Interpreter((Interpreter *)local_80,&local_90);
  if ((local_90.ls != (ListStorage<MiniScript::String> *)0x0) && (local_90.isTemp == false)) {
    plVar8 = &((local_90.ls)->super_RefCountedStorage).refCount;
    *plVar8 = *plVar8 + -1;
    if (*plVar8 == 0) {
      (*((local_90.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      local_90.ls = (ListStorage<MiniScript::String> *)0x0;
    }
  }
  local_78 = PrintToTestOutput;
  local_68 = PrintToTestOutput;
  local_70 = PrintToTestOutput;
  MiniScript::Interpreter::RunUntilDone((Interpreter *)local_80,60.0,false);
  MiniScript::Interpreter::~Interpreter((Interpreter *)local_80);
  pLVar1 = *(ListStorage<MiniScript::String> **)sourceLineNum;
  if (pLVar1 == (ListStorage<MiniScript::String> *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (pLVar1->super_SimpleVector<MiniScript::String>).mQtyItems;
  }
  if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
  }
  pLVar4 = testOutput.ls;
  if ((long)uVar14 < (long)uVar16) {
    pLVar4 = pLVar1;
  }
  if (pLVar4 == (ListStorage<MiniScript::String> *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (pLVar4->super_SimpleVector<MiniScript::String>).mQtyItems;
  }
  local_100 = (long *)sourceLineNum;
  if (0 < (long)uVar14) {
    lVar18 = 0;
    local_148 = 0;
    local_38 = uVar14;
    do {
      if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
        MiniScript::_Error("Assert failed: ls",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                           ,0x3b);
      }
      pLVar1 = testOutput.ls;
      if ((long)local_148 <
          (long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
        pSVar13 = (String *)
                  ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss +
                  lVar18);
      }
      else {
        MiniScript::_Error("invalid index in SimpleVector::operator[]",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                           ,0xc1);
        pSVar13 = (pLVar1->super_SimpleVector<MiniScript::String>).mBuf;
      }
      if (*(long *)sourceLineNum == 0) {
        MiniScript::_Error("Assert failed: ls",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                           ,0x3b);
      }
      lVar20 = *(long *)sourceLineNum;
      if ((long)local_148 < *(long *)(lVar20 + 0x20)) {
        s = (String *)(*(long *)(lVar20 + 0x18) + lVar18);
      }
      else {
        MiniScript::_Error("invalid index in SimpleVector::operator[]",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                           ,0xc1);
        s = *(String **)(lVar20 + 0x18);
      }
      bVar7 = MiniScript::String::operator!=(pSVar13,s);
      if (bVar7) {
        MiniScript::String::Format(&local_a0,(long)&local_108->ls + local_148,"%ld");
        MiniScript::operator+((MiniScript *)&local_d0,"TEST FAILED AT LINE ",&local_a0);
        local_f8 = lVar18;
        MiniScript::String::operator+(&local_120,(char *)&local_d0);
        if (*(long *)sourceLineNum == 0) {
          MiniScript::_Error("Assert failed: ls",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                             ,0x3b);
        }
        lVar18 = *(long *)sourceLineNum;
        if ((long)local_148 < *(long *)(lVar18 + 0x20)) {
          plVar8 = (long *)(*(long *)(lVar18 + 0x18) + local_f8);
        }
        else {
          MiniScript::_Error("invalid index in SimpleVector::operator[]",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                             ,0xc1);
          plVar8 = *(long **)(lVar18 + 0x18);
        }
        pSVar5 = local_120.ss;
        pSVar11 = (StringStorage *)*plVar8;
        if (pSVar11 == (StringStorage *)0x0) {
          local_140 = local_120.ss;
          if (local_120.ss != (StringStorage *)0x0) {
            plVar8 = &((local_120.ss)->super_RefCountedStorage).refCount;
            *plVar8 = *plVar8 + 1;
          }
        }
        else if (local_120.ss == (StringStorage *)0x0) {
          plVar8 = &(pSVar11->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + 1;
          local_140 = pSVar11;
        }
        else {
          sVar2 = (local_120.ss)->dataSize;
          sVar17 = pSVar11->dataSize;
          pSVar9 = (StringStorage *)operator_new(0x30);
          uVar15 = sVar17 + (sVar2 - 1);
          (pSVar9->super_RefCountedStorage).refCount = 1;
          (pSVar9->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001d10b0;
          pSVar9->dataSize = uVar15;
          pSVar9->charCount = -1;
          local_110 = sVar17;
          pcVar10 = (char *)operator_new__(uVar15);
          sVar17 = sVar2 - 1;
          pSVar9->data = pcVar10;
          memset(pcVar10,0,uVar15);
          memcpy(pcVar10,pSVar5->data,sVar17);
          memcpy(pcVar10 + sVar17,pSVar11->data,local_110);
          sourceLineNum = (long)local_100;
          local_140 = pSVar9;
        }
        local_138 = '\0';
        MiniScript::String::operator+((String *)local_80,(char *)&local_140);
        if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
          MiniScript::_Error("Assert failed: ls",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                             ,0x3b);
        }
        pLVar1 = testOutput.ls;
        if ((long)local_148 <
            (long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
          pSVar13 = (String *)
                    ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss +
                    local_f8);
        }
        else {
          MiniScript::_Error("invalid index in SimpleVector::operator[]",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                             ,0xc1);
          pSVar13 = (pLVar1->super_SimpleVector<MiniScript::String>).mBuf;
        }
        auVar6 = local_80;
        auVar19 = (undefined1  [8])pSVar13->ss;
        if (auVar19 == (undefined1  [8])0x0) {
          local_130.ss = (StringStorage *)local_80;
          auVar19 = local_80;
          if (local_80 != (undefined1  [8])0x0) goto LAB_001140d1;
        }
        else if (local_80 == (undefined1  [8])0x0) {
LAB_001140d1:
          plVar8 = &(((StringStorage *)auVar19)->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + 1;
          local_130.ss = (StringStorage *)auVar19;
        }
        else {
          sVar2 = *(size_t *)((long)local_80 + 0x18);
          sVar3 = ((StringStorage *)auVar19)->dataSize;
          pSVar11 = (StringStorage *)operator_new(0x30);
          uVar15 = (sVar3 + sVar2) - 1;
          (pSVar11->super_RefCountedStorage).refCount = 1;
          (pSVar11->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001d10b0;
          pSVar11->dataSize = uVar15;
          pSVar11->charCount = -1;
          local_110 = sVar3;
          pcVar10 = (char *)operator_new__(uVar15);
          sVar17 = sVar2 - 1;
          pSVar11->data = pcVar10;
          memset(pcVar10,0,uVar15);
          memcpy(pcVar10,*(char **)((long)auVar6 + 0x10),sVar17);
          memcpy(pcVar10 + sVar17,((StringStorage *)auVar19)->data,local_110);
          sourceLineNum = (long)local_100;
          local_130.ss = pSVar11;
        }
        pSVar11 = local_130.ss;
        local_130.isTemp = false;
        Print(&local_130,true);
        if (pSVar11 != (StringStorage *)0x0) {
          plVar8 = &(pSVar11->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*(pSVar11->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar11);
          }
          local_130.ss = (StringStorage *)0x0;
        }
        uVar14 = local_38;
        lVar18 = local_f8;
        if ((local_80 != (undefined1  [8])0x0) && (local_78._0_1_ == false)) {
          plVar8 = &((RefCountedStorage *)local_80)->refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*((RefCountedStorage *)local_80)->_vptr_RefCountedStorage[1])();
          }
          local_80 = (undefined1  [8])0x0;
        }
        if ((local_140 != (StringStorage *)0x0) && (local_138 == '\0')) {
          plVar8 = &(local_140->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*(local_140->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_140 = (StringStorage *)0x0;
        }
        if ((local_120.ss != (StringStorage *)0x0) && (local_120.isTemp == false)) {
          plVar8 = &((local_120.ss)->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*((local_120.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_120.ss = (StringStorage *)0x0;
        }
        if ((local_d0 != (long *)0x0) && (local_c8 == '\0')) {
          plVar8 = local_d0 + 1;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (**(code **)(*local_d0 + 8))();
          }
          local_d0 = (long *)0x0;
        }
        if ((local_a0.ss != (StringStorage *)0x0) && (local_a0.isTemp == false)) {
          plVar8 = &((local_a0.ss)->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*((local_a0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_a0.ss = (StringStorage *)0x0;
        }
      }
      local_148 = local_148 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar14 != local_148);
  }
  lVar18 = *(long *)sourceLineNum;
  if (lVar18 == 0) {
    lVar20 = 0;
  }
  else {
    lVar20 = *(long *)(lVar18 + 0x20);
  }
  if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
  }
  if ((long)uVar14 < lVar20) {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    }
    MiniScript::String::Format((String *)local_80,(long)&local_108->ls + uVar14,"%ld");
    MiniScript::operator+
              ((MiniScript *)&local_e0,"TEST FAILED: MISSING OUTPUT AT LINE ",(String *)local_80);
    Print(&local_e0,true);
    if ((local_e0.ss != (StringStorage *)0x0) && (local_e0.isTemp == false)) {
      plVar8 = &((local_e0.ss)->super_RefCountedStorage).refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 == 0) {
        (*((local_e0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_e0.ss = (StringStorage *)0x0;
    }
    if ((local_80 != (undefined1  [8])0x0) && (local_78._0_1_ == false)) {
      plVar8 = &((RefCountedStorage *)local_80)->refCount;
      *plVar8 = *plVar8 + -1;
      if (*plVar8 == 0) {
        (*((RefCountedStorage *)local_80)->_vptr_RefCountedStorage[1])();
      }
      local_80 = (undefined1  [8])0x0;
    }
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    }
    lVar18 = uVar14 << 4;
    while( true ) {
      lVar20 = *(long *)sourceLineNum;
      if (lVar20 == 0) {
        lVar12 = 0;
      }
      else {
        lVar12 = *(long *)(lVar20 + 0x20);
      }
      if (lVar12 <= (long)uVar14) break;
      if (lVar20 == 0) {
        MiniScript::_Error("Assert failed: ls",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                           ,0x3b);
      }
      lVar20 = *(long *)sourceLineNum;
      if (((long)uVar14 < 0) || (*(long *)(lVar20 + 0x20) <= (long)uVar14)) {
        MiniScript::_Error("invalid index in SimpleVector::operator[]",
                           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                           ,0xc1);
        pSVar13 = *(String **)(lVar20 + 0x18);
      }
      else {
        pSVar13 = (String *)(*(long *)(lVar20 + 0x18) + lVar18);
      }
      MiniScript::operator+((MiniScript *)&local_b0,"  MISSING: ",pSVar13);
      Print(&local_b0,true);
      sourceLineNum = (long)local_100;
      if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
        plVar8 = &((local_b0.ss)->super_RefCountedStorage).refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_b0.ss = (StringStorage *)0x0;
      }
      uVar14 = uVar14 + 1;
      lVar18 = lVar18 + 0x10;
    }
  }
  else {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    }
    if (lVar18 == 0) {
      lVar20 = 0;
    }
    else {
      lVar20 = *(long *)(lVar18 + 0x20);
    }
    if (lVar20 < (long)uVar14) {
      if (lVar18 == 0) {
        lVar18 = 0;
      }
      else {
        lVar18 = *(long *)(lVar18 + 0x20);
      }
      MiniScript::String::Format((String *)local_80,(long)&local_108->ls + lVar18,"%ld");
      MiniScript::operator+
                ((MiniScript *)&local_f0,"TEST FAILED: EXTRA OUTPUT AT LINE ",(String *)local_80);
      Print(&local_f0,true);
      if ((local_f0.ss != (StringStorage *)0x0) && (local_f0.isTemp == false)) {
        plVar8 = &((local_f0.ss)->super_RefCountedStorage).refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((local_f0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_f0.ss = (StringStorage *)0x0;
      }
      if ((local_80 != (undefined1  [8])0x0) && (local_78._0_1_ == false)) {
        plVar8 = &((RefCountedStorage *)local_80)->refCount;
        *plVar8 = *plVar8 + -1;
        if (*plVar8 == 0) {
          (*((RefCountedStorage *)local_80)->_vptr_RefCountedStorage[1])();
        }
        local_80 = (undefined1  [8])0x0;
      }
      if (*(long *)sourceLineNum == 0) {
        lVar18 = 0;
      }
      else {
        lVar18 = *(long *)(*(long *)sourceLineNum + 0x20);
      }
      lVar20 = lVar18 << 4;
      while( true ) {
        if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
        }
        if ((long)uVar14 <= lVar18) break;
        if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
          MiniScript::_Error("Assert failed: ls",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                             ,0x3b);
        }
        pLVar1 = testOutput.ls;
        if ((lVar18 < 0) ||
           ((long)((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems <= lVar18)) {
          MiniScript::_Error("invalid index in SimpleVector::operator[]",
                             "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                             ,0xc1);
          pSVar13 = (pLVar1->super_SimpleVector<MiniScript::String>).mBuf;
        }
        else {
          pSVar13 = (String *)
                    ((long)&(((testOutput.ls)->super_SimpleVector<MiniScript::String>).mBuf)->ss +
                    lVar20);
        }
        MiniScript::operator+((MiniScript *)&local_c0,"  EXTRA: ",pSVar13);
        Print(&local_c0,true);
        if ((local_c0.ss != (StringStorage *)0x0) && (local_c0.isTemp == false)) {
          plVar8 = &((local_c0.ss)->super_RefCountedStorage).refCount;
          *plVar8 = *plVar8 + -1;
          if (*plVar8 == 0) {
            (*((local_c0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_c0.ss = (StringStorage *)0x0;
        }
        lVar18 = lVar18 + 1;
        lVar20 = lVar20 + 0x10;
      }
    }
  }
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  return;
}

Assistant:

static void DoOneIntegrationTest(List<String> sourceLines, long sourceLineNum,
				 List<String> expectedOutput, long outputLineNum) {
//	std::cout << "Running test starting at line " << sourceLineNum << std::endl;
	
	testOutput.Clear();
	{
		Interpreter miniscript(sourceLines);
		miniscript.standardOutput = &PrintToTestOutput;
		miniscript.errorOutput = &PrintToTestOutput;
		miniscript.implicitOutput = &PrintToTestOutput;
		miniscript.RunUntilDone(60, false);
	}
	
	long minLen = expectedOutput.Count() < testOutput.Count() ? expectedOutput.Count() : testOutput.Count();
	for (long i = 0; i < minLen; i++) {
		if (testOutput[i] != expectedOutput[i]) {
			Print("TEST FAILED AT LINE " + String::Format(outputLineNum + i)
			+ "\n  EXPECTED: " + expectedOutput[i]
			+ "\n    ACTUAL: " + testOutput[i]);
		}
	}
	if (expectedOutput.Count() > testOutput.Count()) {
		Print("TEST FAILED: MISSING OUTPUT AT LINE " + String::Format(outputLineNum + testOutput.Count()));
		for (long i = testOutput.Count(); i < expectedOutput.Count(); i++) {
			Print("  MISSING: " + expectedOutput[i]);
		}
	} else if (testOutput.Count() > expectedOutput.Count()) {
		Print("TEST FAILED: EXTRA OUTPUT AT LINE " + String::Format(outputLineNum + expectedOutput.Count()));
		for (long i = expectedOutput.Count(); i < testOutput.Count(); i++) {
			Print("  EXTRA: " + testOutput[i]);
		}
	}
	testOutput.Clear();
}